

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::TrendGroup::combineIncompleteGroups(TrendGroup *this,TrendGroup *nextTrendGroup)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined3 uVar5;
  
  bVar1 = nextTrendGroup->t == UNTIL;
  bVar2 = this->t == FROM;
  bVar3 = this->prob == NONE;
  if (bVar1 && (bVar2 && bVar3)) {
    this->t = TIME_SPAN;
    uVar4 = *(undefined8 *)
             ((long)&(nextTrendGroup->tTill).super__Optional_base<metaf::MetafTime,_true,_true>.
                     _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload + 8);
    (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload_base<unsigned_int>)
         (nextTrendGroup->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
         super__Optional_base<unsigned_int,_true,_true>._M_payload;
    *(undefined8 *)
     ((long)&(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = uVar4;
    uVar5 = *(undefined3 *)
             &(nextTrendGroup->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::MetafTime>.field_0x11;
    (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged =
         (nextTrendGroup->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged;
    *(undefined3 *)
     &(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>.field_0x11 = uVar5;
  }
  return bVar1 && (bVar2 && bVar3);
}

Assistant:

bool TrendGroup::combineIncompleteGroups(const TrendGroup & nextTrendGroup) {
	if (probability() != Probability::NONE ||
		type() != Type::FROM ||
		nextTrendGroup.type() != Type::UNTIL) return false;
	t = Type::TIME_SPAN;
	tTill = nextTrendGroup.tTill;
	return true;
}